

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_in_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  int iVar2;
  CURLcode CVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  char scratch [4096];
  
  pvVar1 = reader->ctx;
  if (*(long *)((long)pvVar1 + 0x38) != 0) {
    return CURLE_READ_ERROR;
  }
  if ((data->set).seek_func != (curl_seek_callback)0x0) {
    Curl_set_in_callback(data,true);
    iVar2 = (*(data->set).seek_func)((data->set).seek_client,offset,0);
    Curl_set_in_callback(data,false);
    if (iVar2 == 0) goto LAB_0014a93b;
    if (iVar2 != 2) {
      Curl_failf(data,"Could not seek stream");
      return CURLE_READ_ERROR;
    }
  }
  lVar6 = 0;
  do {
    sVar5 = 0x1000;
    if (offset - lVar6 < 0x1001) {
      sVar5 = curlx_sotouz(offset - lVar6);
    }
    Curl_set_in_callback(data,true);
    lVar4 = (**(code **)((long)pvVar1 + 0x20))(scratch,1,sVar5,*(undefined8 *)((long)pvVar1 + 0x28))
    ;
    Curl_set_in_callback(data,false);
    lVar6 = lVar6 + lVar4;
    if (sVar5 <= lVar4 - 1U) {
      Curl_failf(data,"Could only read %ld bytes from the input",lVar6);
      return CURLE_READ_ERROR;
    }
  } while (lVar6 < offset);
LAB_0014a93b:
  lVar6 = *(long *)((long)pvVar1 + 0x30);
  CVar3 = CURLE_OK;
  if ((0 < lVar6) &&
     (*(long *)((long)pvVar1 + 0x30) = lVar6 - offset, lVar6 - offset == 0 || lVar6 < offset)) {
    Curl_failf(data,"File already completely uploaded");
    CVar3 = CURLE_PARTIAL_FILE;
  }
  return CVar3;
}

Assistant:

static CURLcode cr_in_resume_from(struct Curl_easy *data,
                                  struct Curl_creader *reader,
                                  curl_off_t offset)
{
  struct cr_in_ctx *ctx = reader->ctx;
  int seekerr = CURL_SEEKFUNC_CANTSEEK;

  DEBUGASSERT(data->conn);
  /* already started reading? */
  if(ctx->read_len)
    return CURLE_READ_ERROR;

  if(data->set.seek_func) {
    Curl_set_in_callback(data, TRUE);
    seekerr = data->set.seek_func(data->set.seek_client, offset, SEEK_SET);
    Curl_set_in_callback(data, FALSE);
  }

  if(seekerr != CURL_SEEKFUNC_OK) {
    curl_off_t passed = 0;

    if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
      failf(data, "Could not seek stream");
      return CURLE_READ_ERROR;
    }
    /* when seekerr == CURL_SEEKFUNC_CANTSEEK (cannot seek to offset) */
    do {
      char scratch[4*1024];
      size_t readthisamountnow =
        (offset - passed > (curl_off_t)sizeof(scratch)) ?
        sizeof(scratch) :
        curlx_sotouz(offset - passed);
      size_t actuallyread;

      Curl_set_in_callback(data, TRUE);
      actuallyread = ctx->read_cb(scratch, 1, readthisamountnow,
                                  ctx->cb_user_data);
      Curl_set_in_callback(data, FALSE);

      passed += actuallyread;
      if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
        /* this checks for greater-than only to make sure that the
           CURL_READFUNC_ABORT return code still aborts */
        failf(data, "Could only read %" FMT_OFF_T " bytes from the input",
              passed);
        return CURLE_READ_ERROR;
      }
    } while(passed < offset);
  }

  /* now, decrease the size of the read */
  if(ctx->total_len > 0) {
    ctx->total_len -= offset;

    if(ctx->total_len <= 0) {
      failf(data, "File already completely uploaded");
      return CURLE_PARTIAL_FILE;
    }
  }
  /* we have passed, proceed as normal */
  return CURLE_OK;
}